

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_BrowseNext(UA_Server *server,UA_Session *session,UA_BrowseNextRequest *request,
                       UA_BrowseNextResponse *response)

{
  UA_StatusCode UVar1;
  UA_BrowseResult *pUVar2;
  long lVar3;
  size_t size;
  long lVar4;
  bool bVar5;
  
  size = request->continuationPointsSize;
  if (size == 0) {
    UVar1 = 0x800f0000;
  }
  else {
    pUVar2 = (UA_BrowseResult *)UA_Array_new(size,UA_TYPES + 0x98);
    response->results = pUVar2;
    if (pUVar2 != (UA_BrowseResult *)0x0) {
      response->resultsSize = size;
      lVar3 = 0;
      lVar4 = 0;
      while (bVar5 = size != 0, size = size - 1, bVar5) {
        UA_Server_browseNext_single
                  (server,session,request->releaseContinuationPoints,
                   (UA_ByteString *)((long)&request->continuationPoints->length + lVar4),
                   (UA_BrowseResult *)((long)&response->results->statusCode + lVar3));
        lVar4 = lVar4 + 0x10;
        lVar3 = lVar3 + 0x28;
      }
      return;
    }
    UVar1 = 0x80030000;
  }
  (response->responseHeader).serviceResult = UVar1;
  return;
}

Assistant:

void Service_BrowseNext(UA_Server *server, UA_Session *session, const UA_BrowseNextRequest *request,
                        UA_BrowseNextResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing BrowseNextRequest");
    if(request->continuationPointsSize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }
    size_t size = request->continuationPointsSize;
    response->results = UA_Array_new(size, &UA_TYPES[UA_TYPES_BROWSERESULT]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }

    response->resultsSize = size;
    for(size_t i = 0; i < size; ++i)
        UA_Server_browseNext_single(server, session, request->releaseContinuationPoints,
                                    &request->continuationPoints[i], &response->results[i]);
}